

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::anon_unknown_0::FillTest::testRender(FillTest *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  FillTest *pFVar3;
  bool bVar4;
  int iVar5;
  RenderTarget *pRVar6;
  RenderTarget *pRVar7;
  size_t __n;
  LogImageSet *access;
  ConstPixelBufferAccess *pCVar8;
  PixelBufferAccess *diffMask_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  int iVar9;
  size_t sVar10;
  int x;
  int iVar11;
  bool bVar12;
  allocator<char> local_6990;
  allocator<char> local_698f;
  allocator<char> local_698e;
  allocator<char> local_698d;
  allocator<char> local_698c;
  allocator<char> local_698b;
  allocator<char> local_698a;
  allocator<char> local_6989;
  TestLog *local_6988;
  RenderTarget *local_6980;
  int local_6974;
  FillTest *local_6970;
  Surface refSurface;
  Surface testSurface;
  Surface outputImage;
  IVec4 cTest;
  Surface diffMask;
  string local_68d8;
  string local_68b8;
  string local_6898;
  string local_6878;
  ConstPixelBufferAccess local_6858;
  string local_6830;
  string local_6810;
  string local_67f0;
  ConstPixelBufferAccess local_67d0;
  LogImageSet local_67a8;
  IVec4 cSrc;
  LogImage local_66d8;
  LogImage local_6648;
  MessageBuilder local_65b8;
  ReferenceContextBuffers buffers;
  ReferenceContextLimits local_63b8;
  GLContext glesContext;
  ReferenceContext refContext;
  
  pTVar2 = ((this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  refContext.super_Context._vptr_Context = (_func_int **)0x0;
  refContext.super_Context.m_type.super_ApiType.m_bits = (ApiType)0xc8;
  refContext.super_Context._12_4_ = 200;
  sglr::GLContext::GLContext
            (&glesContext,((this->super_RenderTestCase).super_TestCase.m_context)->m_renderCtx,
             pTVar2,0,(IVec4 *)&refContext);
  local_63b8.extensionStr._M_dataplus._M_p = (pointer)&local_63b8.extensionStr.field_2;
  local_63b8.contextType.super_ApiType.m_bits = (ApiType)0x3;
  local_63b8.maxTextureImageUnits = 0x10;
  local_63b8.maxTexture2DSize = 0x800;
  local_63b8.maxTextureCubeSize = 0x800;
  local_63b8.maxTexture2DArrayLayers = 0x100;
  local_63b8.maxTexture3DSize = 0x100;
  local_63b8.maxRenderbufferSize = 0x800;
  local_63b8.maxVertexAttribs = 0x10;
  local_63b8.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_63b8.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_63b8.extensionList.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_63b8.extensionStr._M_string_length = 0;
  local_63b8.extensionStr.field_2._M_local_buf[0] = '\0';
  pRVar6 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  pRVar7 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  sglr::ReferenceContextBuffers::ReferenceContextBuffers
            (&buffers,&pRVar6->m_pixelFormat,pRVar7->m_depthBits,0,200,200,1);
  sglr::ReferenceContextBuffers::getColorbuffer
            ((MultisamplePixelBufferAccess *)&local_65b8,&buffers);
  sglr::ReferenceContextBuffers::getDepthbuffer
            ((MultisamplePixelBufferAccess *)&local_66d8,&buffers);
  sglr::ReferenceContextBuffers::getStencilbuffer((MultisamplePixelBufferAccess *)&cSrc,&buffers);
  sglr::ReferenceContext::ReferenceContext
            (&refContext,&local_63b8,(MultisamplePixelBufferAccess *)&local_65b8,
             (MultisamplePixelBufferAccess *)&local_66d8,(MultisamplePixelBufferAccess *)&cSrc);
  tcu::Surface::Surface(&testSurface,200,200);
  tcu::Surface::Surface(&refSurface,200,200);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&glesContext);
  sglr::Context::readPixels(&glesContext.super_Context,&testSurface,0,0,200,200);
  (*(this->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&refContext);
  __n = 0;
  sglr::Context::readPixels(&refContext.super_Context,&refSurface,0,0,200,200);
  tcu::Surface::Surface(&outputImage,200,200);
  poVar1 = &local_65b8.m_str;
  local_65b8.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Checking for overdraw ");
  tcu::MessageBuilder::operator<<(&local_65b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  local_6980 = Context::getRenderTarget((this->super_RenderTestCase).super_TestCase.m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_66d8,&testSurface);
  tcu::Surface::getAccess((PixelBufferAccess *)&cSrc,&outputImage);
  tcu::clear((PixelBufferAccess *)&cSrc,(Vec4 *)(anonymous_namespace)::MASK_COLOR_OK);
  sVar10 = 0;
  iVar5 = (int)local_66d8.m_name._M_string_length;
  if ((int)local_66d8.m_name._M_string_length < 1) {
    iVar5 = 0;
  }
  local_6974 = local_66d8.m_name._M_string_length._4_4_;
  if (local_66d8.m_name._M_string_length._4_4_ < 1) {
    local_6974 = 0;
  }
  bVar12 = false;
  local_6988 = pTVar2;
  local_6970 = this;
  while (pTVar2 = local_6988, iVar9 = (int)sVar10, iVar9 != local_6974) {
    for (iVar11 = 0; iVar5 != iVar11; iVar11 = iVar11 + 1) {
      __n = sVar10;
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&cTest,(int)&local_66d8,iVar11,iVar9);
      if (((cTest.m_data[0] != 0) || (cTest.m_data[1] != 0)) || (cTest.m_data[2] != 0)) {
        local_65b8.m_log = (TestLog *)0x7f;
        local_65b8.m_str = (ostringstream)0x0;
        local_65b8._9_7_ = 0;
        local_6648.m_name._M_dataplus._M_p = (pointer)0x10000000014;
        local_6648.m_name._M_string_length = 0x10000000100;
        tcu::operator-((tcu *)&local_67d0,(Vector<int,_4> *)&cTest,(Vector<int,_4> *)&local_65b8);
        tcu::abs<int,4>((tcu *)&local_67a8,(Vector<int,_4> *)&local_67d0);
        tcu::lessThanEqual<int,4>
                  ((tcu *)&local_6858,(Vector<int,_4> *)&local_67a8,(Vector<int,_4> *)&local_6648);
        bVar4 = tcu::boolAll<4>((Vector<bool,_4> *)&local_6858);
        if ((!bVar4) && ((local_6980->m_numSamples < 2 || (0x7e < cTest.m_data[0] + 0x14)))) {
          bVar12 = true;
          __n = sVar10;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&cSrc,(Vec4 *)(anonymous_namespace)::MASK_COLOR_FAIL,
                     iVar11,iVar9,0);
        }
      }
    }
    sVar10 = (size_t)(iVar9 + 1);
  }
  if (bVar12) {
    poVar1 = &local_65b8.m_str;
    local_65b8.m_log = local_6988;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    pFVar3 = local_6970;
    std::operator<<((ostream *)poVar1,"Faulty pixel(s) found.");
    tcu::MessageBuilder::operator<<(&local_65b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cTest,"Images",(allocator<char> *)&local_67f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6858,"Image comparison",(allocator<char> *)&local_6810);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_6648,(string *)&cTest,(string *)&local_6858)
    ;
    iVar5 = (int)pTVar2;
    tcu::LogImageSet::write((LogImageSet *)&local_6648,iVar5,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6878,"TestImage",(allocator<char> *)&local_6830);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6898,"Test image",(allocator<char> *)&diffMask);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_67a8,&testSurface);
    access = &local_67a8;
    tcu::LogImage::LogImage
              (&local_66d8,&local_6878,&local_6898,(ConstPixelBufferAccess *)access,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_66d8,iVar5,__buf_00,(size_t)access);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68b8,"InvalidPixels",&local_698f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68d8,"Invalid pixels",&local_6990);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_67d0,&outputImage);
    pCVar8 = &local_67d0;
    tcu::LogImage::LogImage
              ((LogImage *)&cSrc,&local_68b8,&local_68d8,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&cSrc,iVar5,__buf_01,(size_t)pCVar8);
    tcu::TestLog::endImageSet(pTVar2);
    poVar1 = &local_65b8.m_str;
    local_65b8.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Got overdraw.");
    tcu::MessageBuilder::operator<<(&local_65b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::LogImage::~LogImage((LogImage *)&cSrc);
    std::__cxx11::string::~string((string *)&local_68d8);
    std::__cxx11::string::~string((string *)&local_68b8);
    tcu::LogImage::~LogImage(&local_66d8);
    std::__cxx11::string::~string((string *)&local_6898);
    std::__cxx11::string::~string((string *)&local_6878);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_6648);
    std::__cxx11::string::~string((string *)&local_6858);
    std::__cxx11::string::~string((string *)&cTest);
    tcu::TestContext::setTestResult
              ((pFVar3->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Got overdraw");
  }
  tcu::Surface::~Surface(&outputImage);
  tcu::Surface::Surface(&diffMask,200,200);
  poVar1 = &local_65b8.m_str;
  local_65b8.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Comparing images... ");
  tcu::MessageBuilder::operator<<(&local_65b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_65b8.m_str;
  local_65b8.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Deviation within radius of ");
  std::ostream::operator<<(poVar1,1);
  std::operator<<((ostream *)poVar1," is allowed.");
  tcu::MessageBuilder::operator<<(&local_65b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_65b8,&refSurface);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_66d8,&refSurface);
  iVar9 = 0;
  iVar5 = local_65b8._8_4_;
  if ((int)local_65b8._8_4_ < 1) {
    iVar5 = 0;
  }
  iVar11 = local_65b8._12_4_;
  if ((int)local_65b8._12_4_ < 1) {
    iVar11 = 0;
  }
  local_6980 = (RenderTarget *)CONCAT44(local_6980._4_4_,iVar11);
  for (; iVar9 != (int)local_6980; iVar9 = iVar9 + 1) {
    for (iVar11 = 0; iVar5 != iVar11; iVar11 = iVar11 + 1) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&cSrc,(int)&local_65b8,iVar11,iVar9);
      local_6648.m_name._M_dataplus._M_p = (pointer)cSrc.m_data._0_8_;
      local_6648.m_name._M_string_length = CONCAT44(0xff,cSrc.m_data[2]);
      tcu::PixelBufferAccess::setPixel
                ((PixelBufferAccess *)&local_66d8,(IVec4 *)&local_6648,iVar11,iVar9,0);
    }
  }
  tcu::Surface::getAccess((PixelBufferAccess *)&local_65b8,&testSurface);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_66d8,&refSurface);
  pFVar3 = local_6970;
  pTVar2 = local_6988;
  tcu::Surface::getAccess((PixelBufferAccess *)&cSrc,&diffMask);
  diffMask_00 = (PixelBufferAccess *)&cSrc;
  iVar5 = compareBlackNonBlackImages
                    (pTVar2,(ConstPixelBufferAccess *)&local_65b8,
                     (ConstPixelBufferAccess *)&local_66d8,diffMask_00,1);
  if (0 < iVar5) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6878,"Images",&local_698f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6898,"Image comparison",&local_6990);
    tcu::LogImageSet::LogImageSet(&local_67a8,&local_6878,&local_6898);
    iVar9 = (int)pTVar2;
    tcu::LogImageSet::write(&local_67a8,iVar9,__buf_02,(size_t)diffMask_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68b8,"TestImage",&local_6989);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68d8,"Test image",&local_698a);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_67d0,&testSurface);
    pCVar8 = &local_67d0;
    tcu::LogImage::LogImage
              (&local_66d8,&local_68b8,&local_68d8,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_66d8,iVar9,__buf_03,(size_t)pCVar8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outputImage,"ReferenceImage",&local_698b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_67f0,"Reference image",&local_698c);
    tcu::Surface::getAccess((PixelBufferAccess *)&cTest,&refSurface);
    pCVar8 = (ConstPixelBufferAccess *)&cTest;
    tcu::LogImage::LogImage
              ((LogImage *)&cSrc,(string *)&outputImage,&local_67f0,pCVar8,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&cSrc,iVar9,__buf_04,(size_t)pCVar8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6810,"DifferenceMask",&local_698d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6830,"Difference mask",&local_698e);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_6858,&diffMask);
    pCVar8 = &local_6858;
    tcu::LogImage::LogImage
              (&local_6648,&local_6810,&local_6830,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_6648,iVar9,__buf_05,(size_t)pCVar8);
    tcu::TestLog::endImageSet(pTVar2);
    poVar1 = &local_65b8.m_str;
    local_65b8.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Got ");
    std::ostream::operator<<(poVar1,iVar5);
    std::operator<<((ostream *)poVar1," faulty pixel(s).");
    tcu::MessageBuilder::operator<<(&local_65b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    tcu::LogImage::~LogImage(&local_6648);
    std::__cxx11::string::~string((string *)&local_6830);
    std::__cxx11::string::~string((string *)&local_6810);
    tcu::LogImage::~LogImage((LogImage *)&cSrc);
    std::__cxx11::string::~string((string *)&local_67f0);
    std::__cxx11::string::~string((string *)&outputImage);
    tcu::LogImage::~LogImage(&local_66d8);
    std::__cxx11::string::~string((string *)&local_68d8);
    std::__cxx11::string::~string((string *)&local_68b8);
    tcu::LogImageSet::~LogImageSet(&local_67a8);
    std::__cxx11::string::~string((string *)&local_6898);
    std::__cxx11::string::~string((string *)&local_6878);
    tcu::TestContext::setTestResult
              ((pFVar3->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface(&diffMask);
  tcu::Surface::~Surface(&refSurface);
  tcu::Surface::~Surface(&testSurface);
  sglr::ReferenceContext::~ReferenceContext(&refContext);
  sglr::ReferenceContextBuffers::~ReferenceContextBuffers(&buffers);
  sglr::ReferenceContextLimits::~ReferenceContextLimits(&local_63b8);
  sglr::GLContext::~GLContext(&glesContext);
  return;
}

Assistant:

void FillTest::testRender (void)
{
	using tcu::TestLog;

	const int						numSamples	= 1;

	tcu::TestLog&					log			= m_testCtx.getLog();
	sglr::GLContext					glesContext	(m_context.getRenderContext(), log, 0, tcu::IVec4(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE));
	sglr::ReferenceContextLimits	limits;
	sglr::ReferenceContextBuffers	buffers		(m_context.getRenderTarget().getPixelFormat(), m_context.getRenderTarget().getDepthBits(), 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE, numSamples);
	sglr::ReferenceContext			refContext	(limits, buffers.getColorbuffer(), buffers.getDepthbuffer(), buffers.getStencilbuffer());
	tcu::Surface					testSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::Surface					refSurface	(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	render(glesContext);
	glesContext.readPixels(testSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	render(refContext);
	refContext.readPixels(refSurface, 0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// check overdraw
	{
		bool				overdrawOk;
		tcu::Surface		outputImage(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

		log << TestLog::Message << "Checking for overdraw " << TestLog::EndMessage;
		overdrawOk = checkHalfFilledImageOverdraw(log, m_context.getRenderTarget(), testSurface.getAccess(), outputImage.getAccess());

		if (!overdrawOk)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("InvalidPixels", "Invalid pixels", outputImage.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got overdraw." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got overdraw");
		}
	}

	// compare & check missing pixels
	{
		const int			kernelRadius	= 1;
		tcu::Surface		diffMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		int					faultyPixels;

		log << TestLog::Message << "Comparing images... " << TestLog::EndMessage;
		log << TestLog::Message << "Deviation within radius of " << kernelRadius << " is allowed." << TestLog::EndMessage;

		blitImageOnBlackSurface(refSurface.getAccess(), refSurface.getAccess()); // makes images look right in Candy

		faultyPixels = compareBlackNonBlackImages(log, testSurface.getAccess(), refSurface.getAccess(), diffMask.getAccess(), kernelRadius);

		if (faultyPixels > 0)
		{
			log << TestLog::ImageSet("Images", "Image comparison")
				<< TestLog::Image("TestImage", "Test image", testSurface.getAccess())
				<< TestLog::Image("ReferenceImage", "Reference image", refSurface.getAccess())
				<< TestLog::Image("DifferenceMask", "Difference mask", diffMask.getAccess())
				<< TestLog::EndImageSet
				<< tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
		}
	}
}